

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_TVFS.cpp
# Opt level: O1

DWORD __thiscall
TRootHandler_TVFS::ParsePathFileTable
          (TRootHandler_TVFS *this,TCascStorage *hs,TVFS_DIRECTORY_HEADER *DirHeader,
          PATH_BUFFER *PathBuffer,LPBYTE pbPathTablePtr,LPBYTE pbPathTableEnd)

{
  char *pcVar1;
  DWORD DVar2;
  int iVar3;
  uint uVar4;
  DWORD dwSpanSize;
  TVFS_PATH_TABLE_ENTRY PathEntry;
  ENCODED_KEY EKey;
  TVFS_DIRECTORY_HEADER SubHeader;
  DWORD local_c4;
  TCascStorage *local_c0;
  CASC_FILE_TREE *local_b8;
  TVFS_PATH_TABLE_ENTRY local_b0;
  LPBYTE local_98;
  char *local_90;
  _CONTENT_KEY local_88;
  TVFS_DIRECTORY_HEADER local_78;
  
  local_90 = PathBuffer->szPtr;
  local_c4 = 0;
  local_88.Value[0] = '\0';
  local_88.Value[1] = '\0';
  local_88.Value[2] = '\0';
  local_88.Value[3] = '\0';
  local_88.Value[4] = '\0';
  local_88.Value[5] = '\0';
  local_88.Value[6] = '\0';
  local_88.Value[7] = '\0';
  local_88.Value[8] = '\0';
  local_88.Value[9] = '\0';
  local_88.Value[10] = '\0';
  local_88.Value[0xb] = '\0';
  local_88.Value[0xc] = '\0';
  local_88.Value[0xd] = '\0';
  local_88.Value[0xe] = '\0';
  local_88.Value[0xf] = '\0';
  if (pbPathTablePtr < pbPathTableEnd) {
    local_b8 = &(this->super_TFileTreeRoot).FileTree;
    local_c0 = hs;
    local_98 = pbPathTableEnd;
    do {
      pbPathTablePtr = CapturePathEntry(this,&local_b0,pbPathTablePtr,pbPathTableEnd);
      if (pbPathTablePtr == (LPBYTE)0x0) {
        return 1000;
      }
      PathBuffer_AppendNode(this,PathBuffer,&local_b0);
      if (((byte)local_b0.NodeFlags & 4) != 0) {
        if ((int)local_b0.NodeValue < 0) {
          uVar4 = local_b0.NodeValue & 0x7fffffff;
          if (uVar4 < 4) {
            __assert_fail("(PathEntry.NodeValue & TVFS_FOLDER_SIZE_MASK) >= sizeof(DWORD)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/CascRootFile_TVFS.cpp"
                          ,0x1c2,
                          "DWORD TRootHandler_TVFS::ParsePathFileTable(TCascStorage *, TVFS_DIRECTORY_HEADER &, PATH_BUFFER &, LPBYTE, LPBYTE)"
                         );
          }
          DVar2 = ParsePathFileTable(this,local_c0,DirHeader,PathBuffer,pbPathTablePtr,
                                     pbPathTablePtr + ((ulong)uVar4 - 4));
          pbPathTableEnd = local_98;
          pbPathTablePtr = pbPathTablePtr + ((ulong)uVar4 - 4);
          if (DVar2 != 0) {
            return DVar2;
          }
        }
        else {
          DVar2 = CaptureVfsSpanEntries(this,DirHeader,&local_88,&local_c4,local_b0.NodeValue);
          if (DVar2 != 0) {
            return DVar2;
          }
          iVar3 = IsVfsSubDirectory(this,local_c0,DirHeader,&local_78,&local_88,local_c4);
          if (iVar3 == 0) {
            pcVar1 = PathBuffer->szPtr;
            if (pcVar1 < PathBuffer->szEnd) {
              PathBuffer->szPtr = pcVar1 + 1;
              *pcVar1 = ':';
              *PathBuffer->szPtr = '\0';
            }
            CASC_FILE_TREE::Insert
                      (local_b8,&local_88,PathBuffer->szBegin,0xffffffff,local_c4,0xffffffff);
            ParseDirectoryData(this,local_c0,&local_78,PathBuffer);
            free(local_78.pbDirectoryData);
          }
          else {
            CASC_FILE_TREE::Insert
                      (local_b8,&local_88,PathBuffer->szBegin,0xffffffff,local_c4,0xffffffff);
          }
        }
        PathBuffer->szPtr = local_90;
        *local_90 = '\0';
      }
    } while (pbPathTablePtr < pbPathTableEnd);
  }
  return 0;
}

Assistant:

DWORD ParsePathFileTable(TCascStorage * hs, TVFS_DIRECTORY_HEADER & DirHeader, PATH_BUFFER & PathBuffer, LPBYTE pbPathTablePtr, LPBYTE pbPathTableEnd)
    {
        TVFS_DIRECTORY_HEADER SubHeader;
        TVFS_PATH_TABLE_ENTRY PathEntry;
        ENCODED_KEY EKey;
        char * szSavePathPtr = PathBuffer.szPtr;
        DWORD dwSpanSize = 0;
        int nError;

        // Prepare the EKey structure to be filled with zeros
        memset(&EKey, 0, sizeof(ENCODED_KEY));

        // Parse the file table
        while(pbPathTablePtr < pbPathTableEnd)
        {
            // Capture the single path table entry
            pbPathTablePtr = CapturePathEntry(PathEntry, pbPathTablePtr, pbPathTableEnd);
            if(pbPathTablePtr == NULL)
                return ERROR_BAD_FORMAT;

            // Append the node name to the total path. Also add backslash, if it's a folder
            PathBuffer_AppendNode(PathBuffer, PathEntry);

            // Folder component
            if (PathEntry.NodeFlags & TVFS_PTE_NODE_VALUE)
            {
                // If the TVFS_FOLDER_NODE is set, then the path node is a directory,
                // with its data immediately following the path node. Lower 31 bits of NodeValue
                // contain the length of the directory (including the NodeValue!)
                if (PathEntry.NodeValue & TVFS_FOLDER_NODE)
                {
                    LPBYTE pbDirectoryEnd = pbPathTablePtr + (PathEntry.NodeValue & TVFS_FOLDER_SIZE_MASK) - sizeof(DWORD);

                    // Check the available data
                    assert((PathEntry.NodeValue & TVFS_FOLDER_SIZE_MASK) >= sizeof(DWORD));

                    // Recursively call the folder parser on the same file
                    nError = ParsePathFileTable(hs, DirHeader, PathBuffer, pbPathTablePtr, pbDirectoryEnd);
                    if (nError != ERROR_SUCCESS)
                        return nError;

                    // Skip the directory data
                    pbPathTablePtr = pbDirectoryEnd;
                }
                else
                {
                    // Capture the VFS and Container Table Entry in order to get the file EKey
                    nError = CaptureVfsSpanEntries(DirHeader, &EKey, &dwSpanSize, PathEntry.NodeValue);
                    if (nError != ERROR_SUCCESS)
                        return nError;

                    // We need to check whether this is another TVFS directory file
                    if (IsVfsSubDirectory(hs, DirHeader, SubHeader, EKey, dwSpanSize) == ERROR_SUCCESS)
                    {
                        // Add colon (':')
                        PathBuffer_AddChar(PathBuffer, ':');

                        // Insert the file to the file tree
                        FileTree.Insert(&EKey, PathBuffer.szBegin, CASC_INVALID_ID, dwSpanSize);

                        ParseDirectoryData(hs, SubHeader, PathBuffer);
                        CASC_FREE(SubHeader.pbDirectoryData);
                    }
                    else
                    {
//                      if (fp != NULL)
//                      {
//                          fwrite(PathBuffer.szBegin, 1, (PathBuffer.szPtr - PathBuffer.szBegin), fp);
//                          fprintf(fp, "\n");
//                      }

                        // Insert the file to the file tree
                        FileTree.Insert(&EKey, PathBuffer.szBegin, CASC_INVALID_ID, dwSpanSize);
                    }
                }

                // Reset the position of the path buffer
                PathBuffer.szPtr = szSavePathPtr;
                PathBuffer.szPtr[0] = 0;
            }
        }

        // Return the total number of entries
        return ERROR_SUCCESS;
    }